

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageColorBrightness(Image *image,int brightness)

{
  uchar uVar1;
  Color *pCVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uchar uVar10;
  int iVar11;
  Image in_stack_00000000;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    iVar5 = -0xff;
    if (-0xff < brightness) {
      iVar5 = brightness;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    pCVar2 = LoadImageColors(in_stack_00000000);
    if (0 < image->height * image->width) {
      lVar3 = 0;
      do {
        iVar4 = (uint)pCVar2[lVar3].r + iVar5;
        iVar6 = (uint)pCVar2[lVar3].g + iVar5;
        iVar7 = (uint)pCVar2[lVar3].b + iVar5;
        iVar8 = 0xff;
        if (iVar4 < 0xff) {
          iVar8 = iVar4;
        }
        iVar9 = 0xff;
        if (iVar6 < 0xff) {
          iVar9 = iVar6;
        }
        iVar11 = 0xff;
        if (iVar7 < 0xff) {
          iVar11 = iVar7;
        }
        uVar10 = (uchar)iVar8;
        if (iVar4 < 0) {
          uVar10 = '\x01';
        }
        uVar1 = (uchar)iVar9;
        if (iVar6 < 0) {
          uVar1 = '\x01';
        }
        pCVar2[lVar3].r = uVar10;
        pCVar2[lVar3].g = uVar1;
        uVar10 = (uchar)iVar11;
        if (iVar7 < 0) {
          uVar10 = '\x01';
        }
        pCVar2[lVar3].b = uVar10;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (long)image->height * (long)image->width);
    }
    iVar5 = image->format;
    free(image->data);
    image->data = pCVar2;
    image->format = 7;
    ImageFormat(image,iVar5);
    return;
  }
  return;
}

Assistant:

void ImageColorBrightness(Image *image, int brightness)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (brightness < -255) brightness = -255;
    if (brightness > 255) brightness = 255;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        int cR = pixels[i].r + brightness;
        int cG = pixels[i].g + brightness;
        int cB = pixels[i].b + brightness;

        if (cR < 0) cR = 1;
        if (cR > 255) cR = 255;

        if (cG < 0) cG = 1;
        if (cG > 255) cG = 255;

        if (cB < 0) cB = 1;
        if (cB > 255) cB = 255;

        pixels[i].r = (unsigned char)cR;
        pixels[i].g = (unsigned char)cG;
        pixels[i].b = (unsigned char)cB;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}